

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O1

void __thiscall
slang::analysis::SampledValueFuncVisitor::visit<slang::ast::NewCovergroupExpression>
          (SampledValueFuncVisitor *this,NewCovergroupExpression *expr)

{
  size_t sVar1;
  pointer ppEVar2;
  Expression *this_00;
  bool bVar3;
  KnownSystemName KVar4;
  Diagnostic *this_01;
  long lVar5;
  string_view arg;
  long lStack_30;
  
  bVar3 = ClockInference::isSampledValueFuncCall(&expr->super_Expression);
  if (bVar3) {
    KVar4 = ast::CallExpression::getKnownSystemName((CallExpression *)expr);
    sVar1 = expr[1].arguments._M_extent._M_extent_value;
    if (KVar4 == Past) {
      if (sVar1 != 4) goto LAB_0014c3ff;
      lStack_30 = 0x18;
    }
    else {
      if (sVar1 != 2) goto LAB_0014c3ff;
      lStack_30 = 8;
    }
    if (**(int **)((long)expr[1].arguments._M_ptr + lStack_30) == 0x1e) {
LAB_0014c3ff:
      this_01 = AnalysisContext::addDiag
                          (this->context,this->parentSymbol,(DiagCode)0x8000e,
                           (expr->super_Expression).sourceRange);
      arg = ast::CallExpression::getSubroutineName((CallExpression *)expr);
      Diagnostic::operator<<(this_01,arg);
      return;
    }
  }
  else {
    sVar1 = (expr->arguments)._M_extent._M_extent_value;
    if (sVar1 != 0) {
      ppEVar2 = (expr->arguments)._M_ptr;
      lVar5 = 0;
      do {
        this_00 = *(Expression **)((long)ppEVar2 + lVar5);
        ast::Expression::
        visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
                  (this_00,this_00,this);
        lVar5 = lVar5 + 8;
      } while (sVar1 << 3 != lVar5);
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                auto& call = expr.template as<CallExpression>();
                bool hasClock;
                if (call.getKnownSystemName() == KnownSystemName::Past) {
                    hasClock = call.arguments().size() == 4 &&
                               call.arguments()[3]->kind != ExpressionKind::EmptyArgument;
                }
                else {
                    hasClock = call.arguments().size() == 2 &&
                               call.arguments()[1]->kind != ExpressionKind::EmptyArgument;
                }

                if (!hasClock) {
                    context.addDiag(parentSymbol, diag::SampledValueFuncClock, call.sourceRange)
                        << call.getSubroutineName();
                }
            }
            else if constexpr (HasVisitExprs<T, SampledValueFuncVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }